

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  QFormLayoutPrivate *this_00;
  long *in_RDI;
  QFormLayoutPrivate *unaff_retaddr;
  QFormLayoutPrivate *d;
  undefined4 in_stack_00000018;
  undefined4 in_stack_fffffffffffffff0;
  long *plVar3;
  
  plVar3 = in_RDI;
  this_00 = d_func((QFormLayout *)0x4b6134);
  bVar1 = QLayoutPrivate::checkWidget((QLayoutPrivate *)CONCAT44(row,in_stack_00000018),widget);
  if (bVar1) {
    iVar2 = QFormLayoutPrivate::insertRow(this_00,(int)((ulong)in_RDI >> 0x20));
    QFormLayoutPrivate::setWidget
              (unaff_retaddr,(int)((ulong)plVar3 >> 0x20),(ItemRole)plVar3,
               (QWidget *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    (**(code **)(*in_RDI + 0x70))();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, QWidget *widget)
{
    Q_D(QFormLayout);
    if (!d->checkWidget(widget))
        return;

    row = d->insertRow(row);
    d->setWidget(row, SpanningRole, widget);
    invalidate();
}